

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxVectorBuiltin::Resolve(FxVectorBuiltin *this,FCompileContext *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  PFloat **ppPVar3;
  FxExpression *pFVar2;
  
  if (this->Self != (FxExpression *)0x0) {
    iVar1 = (*this->Self->_vptr_FxExpression[2])();
    pFVar2 = (FxExpression *)CONCAT44(extraout_var,iVar1);
    this->Self = pFVar2;
    if (pFVar2 != (FxExpression *)0x0) {
      if (((PStruct *)pFVar2->ValueType != TypeVector2) &&
         ((PStruct *)pFVar2->ValueType != TypeVector3)) {
        __assert_fail("Self->IsVector()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x2039,"virtual FxExpression *FxVectorBuiltin::Resolve(FCompileContext &)");
      }
      if ((this->Function).Index == 0x279) {
        ppPVar3 = &TypeFloat64;
      }
      else {
        ppPVar3 = (PFloat **)&pFVar2->ValueType;
      }
      (this->super_FxExpression).ValueType = (PType *)*ppPVar3;
      return &this->super_FxExpression;
    }
  }
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxVectorBuiltin::Resolve(FCompileContext &ctx)
{
	SAFE_RESOLVE(Self, ctx);
	assert(Self->IsVector());	// should never be created for anything else.
	ValueType = Function == NAME_Length ? TypeFloat64 : Self->ValueType;
	return this;
}